

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Annotation.h
# Opt level: O0

void __thiscall
OpenSteer::AnnotationMixin<OpenSteer::LocalSpaceMixin<OpenSteer::AbstractVehicle>_>::AnnotationMixin
          (AnnotationMixin<OpenSteer::LocalSpaceMixin<OpenSteer::AbstractVehicle>_> *this)

{
  undefined8 *in_RDI;
  int in_stack_00000028;
  float in_stack_0000002c;
  AnnotationMixin<OpenSteer::LocalSpaceMixin<OpenSteer::AbstractVehicle>_> *in_stack_00000030;
  LocalSpaceMixin<OpenSteer::AbstractVehicle> *in_stack_fffffffffffffff0;
  
  LocalSpaceMixin<OpenSteer::AbstractVehicle>::LocalSpaceMixin(in_stack_fffffffffffffff0);
  *in_RDI = &PTR__AnnotationMixin_001c2638;
  Vec3::Vec3((Vec3 *)(in_RDI + 10));
  in_RDI[0xc] = 0;
  in_RDI[0xd] = 0;
  setTrailParameters(in_stack_00000030,in_stack_0000002c,in_stack_00000028);
  return;
}

Assistant:

OpenSteer::AnnotationMixin<Super>::AnnotationMixin (void)
{
    trailVertices = NULL;
    trailFlags = NULL;

    // xxx I wonder if it makes more sense to NOT do this here, see if the
    // xxx vehicle class calls it to set custom parameters, and if not, set
    // xxx these default parameters on first call to a "trail" function.  The
    // xxx issue is whether it is a problem to allocate default-sized arrays
    // xxx then to free them and allocate new ones
    setTrailParameters (5, 100);  // 5 seconds with 100 points along the trail
}